

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

void Opa_ManPrint2(Opa_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  bool bVar2;
  uint local_24;
  int local_20;
  int Count;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Opa_Man_t *p_local;
  
  printf("Groups %d: ",(ulong)(uint)p->nParts);
  for (Count = 0; iVar1 = Gia_ManPoNum(p->pGia), Count < iVar1; Count = Count + 1) {
    if (p->pvParts[Count].nSize != 0) {
      local_24 = 0;
      local_20 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->pvParts + Count);
        bVar2 = false;
        if (local_20 < iVar1) {
          p_00 = p->pGia;
          iVar1 = Vec_IntEntry(p->pvParts + Count,local_20);
          _k = Gia_ManObj(p_00,iVar1);
          bVar2 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar2) break;
        iVar1 = Gia_ObjIsPo(p->pGia,_k);
        local_24 = iVar1 + local_24;
        local_20 = local_20 + 1;
      }
      printf("%d ",(ulong)local_24);
    }
  }
  printf("\n");
  return;
}

Assistant:

static inline void Opa_ManPrint2( Opa_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, Count;
    printf( "Groups %d: ", p->nParts );
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
    {
        if ( p->pvParts[i].nSize == 0 )
            continue;
        // count POs in this group
        Count = 0;
        Gia_ManForEachObjVec( p->pvParts + i, p->pGia, pObj, k )
            Count += Gia_ObjIsPo(p->pGia, pObj);
        printf( "%d ", Count );
    }
    printf( "\n" );
}